

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_refining_search_8p_c
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,FULLPEL_MV *best_mv)

{
  search_neighbors sVar1;
  byte bVar2;
  int iVar3;
  buf_2d *pbVar4;
  buf_2d *pbVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint8_t *puVar19;
  uint uVar20;
  int j;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  short sVar24;
  short sVar26;
  FULLPEL_MV FVar25;
  uint8_t do_refine_search_grid [49];
  
  do_refine_search_grid[0x20] = '\0';
  do_refine_search_grid[0x21] = '\0';
  do_refine_search_grid[0x22] = '\0';
  do_refine_search_grid[0x23] = '\0';
  do_refine_search_grid[0x24] = '\0';
  do_refine_search_grid[0x25] = '\0';
  do_refine_search_grid[0x26] = '\0';
  do_refine_search_grid[0x27] = '\0';
  do_refine_search_grid[0x28] = '\0';
  do_refine_search_grid[0x29] = '\0';
  do_refine_search_grid[0x2a] = '\0';
  do_refine_search_grid[0x2b] = '\0';
  do_refine_search_grid[0x2c] = '\0';
  do_refine_search_grid[0x2d] = '\0';
  do_refine_search_grid[0x2e] = '\0';
  do_refine_search_grid[0x2f] = '\0';
  do_refine_search_grid[0x10] = '\0';
  do_refine_search_grid[0x11] = '\0';
  do_refine_search_grid[0x12] = '\0';
  do_refine_search_grid[0x13] = '\0';
  do_refine_search_grid[0x14] = '\0';
  do_refine_search_grid[0x15] = '\0';
  do_refine_search_grid[0x16] = '\0';
  do_refine_search_grid[0x17] = '\0';
  do_refine_search_grid[0x18] = '\0';
  do_refine_search_grid[0x19] = '\0';
  do_refine_search_grid[0x1a] = '\0';
  do_refine_search_grid[0x1b] = '\0';
  do_refine_search_grid[0x1c] = '\0';
  do_refine_search_grid[0x1d] = '\0';
  do_refine_search_grid[0x1e] = '\0';
  do_refine_search_grid[0x1f] = '\0';
  do_refine_search_grid[0] = '\0';
  do_refine_search_grid[1] = '\0';
  do_refine_search_grid[2] = '\0';
  do_refine_search_grid[3] = '\0';
  do_refine_search_grid[4] = '\0';
  do_refine_search_grid[5] = '\0';
  do_refine_search_grid[6] = '\0';
  do_refine_search_grid[7] = '\0';
  do_refine_search_grid[8] = '\0';
  do_refine_search_grid[9] = '\0';
  do_refine_search_grid[10] = '\0';
  do_refine_search_grid[0xb] = '\0';
  do_refine_search_grid[0xc] = '\0';
  do_refine_search_grid[0xd] = '\0';
  do_refine_search_grid[0xe] = '\0';
  do_refine_search_grid[0xf] = '\0';
  do_refine_search_grid[0x30] = '\0';
  pbVar4 = (ms_params->ms_buffers).ref;
  pbVar5 = (ms_params->ms_buffers).src;
  iVar3 = pbVar4->stride;
  *best_mv = start_mv;
  iVar11 = (int)best_mv->col;
  iVar15 = (ms_params->mv_limits).col_min;
  iVar12 = (ms_params->mv_limits).col_max;
  if (iVar11 < iVar12) {
    iVar12 = iVar11;
  }
  sVar24 = (short)iVar12;
  if (iVar11 < iVar15) {
    sVar24 = (short)iVar15;
  }
  best_mv->col = sVar24;
  iVar12 = (int)start_mv.row;
  iVar15 = (ms_params->mv_limits).row_max;
  if (iVar12 < iVar15) {
    iVar15 = iVar12;
  }
  iVar11 = (ms_params->mv_limits).row_min;
  sVar26 = (short)iVar15;
  if (iVar12 < iVar11) {
    sVar26 = (short)iVar11;
  }
  best_mv->row = sVar26;
  puVar19 = pbVar4->buf + ((int)sVar24 + (int)sVar26 * pbVar4->stride);
  puVar6 = (ms_params->ms_buffers).second_pred;
  puVar7 = pbVar5->buf;
  iVar15 = pbVar5->stride;
  puVar8 = (ms_params->ms_buffers).mask;
  if (puVar8 == (uint8_t *)0x0) {
    if (puVar6 == (uint8_t *)0x0) {
      uVar13 = (*ms_params->sdf)(puVar7,iVar15,puVar19,iVar3);
    }
    else {
      uVar13 = (*ms_params->vfp->sdaf)(puVar7,iVar15,puVar19,iVar3,puVar6);
    }
  }
  else {
    uVar13 = (*ms_params->vfp->msdf)
                       (puVar7,iVar15,puVar19,iVar3,puVar6,puVar8,
                        (ms_params->ms_buffers).mask_stride,(ms_params->ms_buffers).inv_mask);
  }
  bVar2 = (ms_params->mv_cost_params).mv_cost_type;
  iVar15 = 0;
  uVar20 = 0;
  if (bVar2 < 4) {
    FVar25 = (ms_params->mv_cost_params).full_ref_mv;
    auVar23 = psllw(ZEXT416(CONCAT22((*best_mv).col - FVar25.col,(*best_mv).row - FVar25.row)),3);
    sVar24 = auVar23._0_2_;
    sVar26 = auVar23._2_2_;
    switch(bVar2) {
    case 0:
      uVar20 = ((ms_params->mv_cost_params).mvcost[0][sVar24] +
                *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                        (ulong)((uint)(sVar26 != 0) * 4 + (uint)(sVar24 != 0) * 8)) +
               (ms_params->mv_cost_params).mvcost[1][sVar26]) *
               (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      sVar9 = -sVar24;
      sVar10 = -sVar26;
      uVar20 = ((uint)(ushort)((ushort)(sVar10 < sVar26) * sVar26 |
                              (ushort)(sVar10 >= sVar26) * sVar10) +
               (uint)(ushort)((ushort)(sVar9 < sVar24) * sVar24 | (ushort)(sVar9 >= sVar24) * sVar9)
               ) * 4;
      break;
    case 2:
      sVar9 = -sVar24;
      sVar10 = -sVar26;
      uVar20 = ((uint)(ushort)((ushort)(sVar10 < sVar26) * sVar26 |
                              (ushort)(sVar10 >= sVar26) * sVar10) +
               (uint)(ushort)((ushort)(sVar9 < sVar24) * sVar24 | (ushort)(sVar9 >= sVar24) * sVar9)
               ) * 0xf >> 3;
      break;
    case 3:
      sVar9 = -sVar24;
      sVar10 = -sVar26;
      uVar20 = (uint)(ushort)((ushort)(sVar10 < sVar26) * sVar26 |
                             (ushort)(sVar10 >= sVar26) * sVar10) +
               (uint)(ushort)((ushort)(sVar9 < sVar24) * sVar24 | (ushort)(sVar9 >= sVar24) * sVar9)
      ;
    }
  }
  uVar20 = uVar20 + uVar13;
  do_refine_search_grid[0x18] = '\x01';
  iVar12 = 0x18;
  while( true ) {
    iVar11 = -1;
    lVar21 = 0;
    do {
      lVar16 = (long)av1_refining_search_8p_c::neighbors[lVar21].coord_offset + (long)iVar12;
      if (do_refine_search_grid[lVar16] != '\x01') {
        sVar1 = av1_refining_search_8p_c::neighbors[lVar21];
        sVar24 = sVar1.coord.row + (*best_mv).row;
        sVar26 = sVar1.coord.col + (*best_mv).col;
        auVar23._4_2_ = (undefined2)sVar1.coord_offset;
        do_refine_search_grid[lVar16] = '\x01';
        iVar14 = (int)sVar26;
        if (((((ms_params->mv_limits).col_min <= iVar14) &&
             (iVar14 <= (ms_params->mv_limits).col_max)) &&
            (iVar17 = (int)sVar24, (ms_params->mv_limits).row_min <= iVar17)) &&
           (iVar17 <= (ms_params->mv_limits).row_max)) {
          puVar19 = pbVar4->buf + (iVar17 * pbVar4->stride + iVar14);
          puVar6 = (ms_params->ms_buffers).second_pred;
          puVar7 = pbVar5->buf;
          iVar14 = pbVar5->stride;
          puVar8 = (ms_params->ms_buffers).mask;
          if (puVar8 == (uint8_t *)0x0) {
            if (puVar6 == (uint8_t *)0x0) {
              uVar13 = (*ms_params->sdf)(puVar7,iVar14,puVar19,iVar3);
            }
            else {
              uVar13 = (*ms_params->vfp->sdaf)(puVar7,iVar14,puVar19,iVar3,puVar6);
            }
          }
          else {
            uVar13 = (*ms_params->vfp->msdf)
                               (puVar7,iVar14,puVar19,iVar3,puVar6,puVar8,
                                (ms_params->ms_buffers).mask_stride,(ms_params->ms_buffers).inv_mask
                               );
          }
          if (uVar13 < uVar20) {
            bVar2 = (ms_params->mv_cost_params).mv_cost_type;
            if (bVar2 < 4) {
              FVar25 = (ms_params->mv_cost_params).full_ref_mv;
              auVar23._0_2_ = sVar24 - FVar25.row;
              auVar23._2_2_ = sVar26 - FVar25.col;
              auVar23._6_2_ = sVar1.coord_offset._2_2_;
              auVar23._8_8_ = 0;
              auVar23 = psllw(auVar23,3);
              sVar24 = auVar23._0_2_;
              sVar26 = auVar23._2_2_;
              switch(bVar2) {
              case 0:
                uVar18 = ((ms_params->mv_cost_params).mvcost[0][sVar24] +
                          *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                  (ulong)((uint)(sVar26 != 0) * 4 + (uint)(sVar24 != 0) * 8)) +
                         (ms_params->mv_cost_params).mvcost[1][sVar26]) *
                         (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                break;
              case 1:
                sVar9 = -sVar24;
                sVar10 = -sVar26;
                uVar18 = ((uint)(ushort)((ushort)(sVar10 < sVar26) * sVar26 |
                                        (ushort)(sVar10 >= sVar26) * sVar10) +
                         (uint)(ushort)((ushort)(sVar9 < sVar24) * sVar24 |
                                       (ushort)(sVar9 >= sVar24) * sVar9)) * 4;
                break;
              case 2:
                sVar9 = -sVar24;
                sVar10 = -sVar26;
                uVar18 = ((uint)(ushort)((ushort)(sVar10 < sVar26) * sVar26 |
                                        (ushort)(sVar10 >= sVar26) * sVar10) +
                         (uint)(ushort)((ushort)(sVar9 < sVar24) * sVar24 |
                                       (ushort)(sVar9 >= sVar24) * sVar9)) * 0xf >> 3;
                break;
              case 3:
                sVar9 = -sVar24;
                sVar10 = -sVar26;
                uVar18 = (uint)(ushort)((ushort)(sVar10 < sVar26) * sVar26 |
                                       (ushort)(sVar10 >= sVar26) * sVar10) +
                         (uint)(ushort)((ushort)(sVar9 < sVar24) * sVar24 |
                                       (ushort)(sVar9 >= sVar24) * sVar9);
              }
            }
            else {
              uVar18 = 0;
            }
            uVar18 = uVar18 + uVar13;
            bVar22 = uVar18 < uVar20;
            if (bVar22) {
              uVar20 = uVar18;
            }
            if (bVar22) {
              iVar11 = (int)lVar21;
            }
          }
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 8);
    if (iVar11 == -1) break;
    FVar25.row = (*best_mv).row + av1_refining_search_8p_c::neighbors[iVar11].coord;
    FVar25.col = (*best_mv).col + SUB82(av1_refining_search_8p_c::neighbors[iVar11],2);
    *best_mv = FVar25;
    iVar12 = iVar12 + av1_refining_search_8p_c::neighbors[iVar11].coord_offset;
    iVar15 = iVar15 + 1;
    if (iVar15 == 3) {
      return uVar20;
    }
  }
  return uVar20;
}

Assistant:

int av1_refining_search_8p_c(const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                             const FULLPEL_MV start_mv, FULLPEL_MV *best_mv) {
  static const search_neighbors neighbors[8] = {
    { { -1, 0 }, -1 * SEARCH_GRID_STRIDE_8P + 0 },
    { { 0, -1 }, 0 * SEARCH_GRID_STRIDE_8P - 1 },
    { { 0, 1 }, 0 * SEARCH_GRID_STRIDE_8P + 1 },
    { { 1, 0 }, 1 * SEARCH_GRID_STRIDE_8P + 0 },
    { { -1, -1 }, -1 * SEARCH_GRID_STRIDE_8P - 1 },
    { { 1, -1 }, 1 * SEARCH_GRID_STRIDE_8P - 1 },
    { { -1, 1 }, -1 * SEARCH_GRID_STRIDE_8P + 1 },
    { { 1, 1 }, 1 * SEARCH_GRID_STRIDE_8P + 1 }
  };

  uint8_t do_refine_search_grid[SEARCH_GRID_STRIDE_8P *
                                SEARCH_GRID_STRIDE_8P] = { 0 };
  int grid_center = SEARCH_GRID_CENTER_8P;
  int grid_coord = grid_center;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const struct buf_2d *src = ms_buffers->src;
  const struct buf_2d *ref = ms_buffers->ref;
  const int ref_stride = ref->stride;

  *best_mv = start_mv;
  clamp_fullmv(best_mv, mv_limits);

  unsigned int best_sad = get_mvpred_compound_sad(
      ms_params, src, get_buf_from_fullmv(ref, best_mv), ref_stride);
  best_sad += mvsad_err_cost_(best_mv, mv_cost_params);

  do_refine_search_grid[grid_coord] = 1;

  for (int i = 0; i < SEARCH_RANGE_8P; ++i) {
    int best_site = -1;

    for (int j = 0; j < 8; ++j) {
      grid_coord = grid_center + neighbors[j].coord_offset;
      if (do_refine_search_grid[grid_coord] == 1) {
        continue;
      }
      const FULLPEL_MV mv = { best_mv->row + neighbors[j].coord.row,
                              best_mv->col + neighbors[j].coord.col };

      do_refine_search_grid[grid_coord] = 1;
      if (av1_is_fullmv_in_range(mv_limits, mv)) {
        unsigned int sad;
        sad = get_mvpred_compound_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = j;
          }
        }
      }
    }

    if (best_site == -1) {
      break;
    } else {
      best_mv->row += neighbors[best_site].coord.row;
      best_mv->col += neighbors[best_site].coord.col;
      grid_center += neighbors[best_site].coord_offset;
    }
  }
  return best_sad;
}